

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

int find_interp_filter_match
              (MB_MODE_INFO *mbmi,AV1_COMP *cpi,InterpFilter assign_filter,int need_search,
              INTERPOLATION_FILTER_STATS *interp_filter_stats,int interp_filter_stats_idx)

{
  int in_ECX;
  long in_RSI;
  MB_MODE_INFO *in_R8;
  undefined4 in_R9D;
  int match_found_idx;
  undefined3 in_stack_00000014;
  undefined4 local_28;
  InterpFilter frame_interp_filter;
  
  frame_interp_filter = (InterpFilter)((uint)in_R9D >> 0x18);
  local_28 = -1;
  if ((*(int *)(in_RSI + 0x60b48) != 0) && (in_ECX != 0)) {
    local_28 = find_interp_filter_in_stats
                         ((MB_MODE_INFO *)cpi,
                          (INTERPOLATION_FILTER_STATS *)CONCAT44(_in_stack_00000014,need_search),
                          interp_filter_stats._4_4_,(int)interp_filter_stats);
  }
  if ((in_ECX == 0) || (local_28 == -1)) {
    set_default_interp_filters(in_R8,frame_interp_filter);
  }
  return local_28;
}

Assistant:

static int find_interp_filter_match(
    MB_MODE_INFO *const mbmi, const AV1_COMP *const cpi,
    const InterpFilter assign_filter, const int need_search,
    INTERPOLATION_FILTER_STATS *interp_filter_stats,
    int interp_filter_stats_idx) {
  int match_found_idx = -1;
  if (cpi->sf.interp_sf.use_interp_filter && need_search)
    match_found_idx = find_interp_filter_in_stats(
        mbmi, interp_filter_stats, interp_filter_stats_idx,
        cpi->sf.interp_sf.use_interp_filter);

  if (!need_search || match_found_idx == -1)
    set_default_interp_filters(mbmi, assign_filter);
  return match_found_idx;
}